

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaItemListGrow(xmlSchemaItemListPtr list,int initialSize)

{
  void **ppvVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 1;
  if (1 < initialSize) {
    uVar4 = initialSize;
  }
  iVar2 = list->sizeItems;
  if (((0 < iVar2) && (uVar4 = 0xffffffff, iVar2 < 1000000000)) &&
     (uVar3 = iVar2 + 1U >> 1, uVar4 = uVar3 + iVar2, (int)(1000000000 - uVar3) < iVar2)) {
    uVar4 = 1000000000;
  }
  iVar2 = -1;
  if (-1 < (int)uVar4) {
    ppvVar1 = (void **)(*xmlRealloc)(list->items,(ulong)uVar4 << 3);
    if (ppvVar1 != (void **)0x0) {
      list->items = ppvVar1;
      list->sizeItems = uVar4;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaItemListGrow(xmlSchemaItemListPtr list, int initialSize)
{
    void **tmp;
    int newSize;

    if (initialSize <= 0)
        initialSize = 1;
    newSize = xmlGrowCapacity(list->sizeItems, sizeof(tmp[0]),
                              initialSize, XML_MAX_ITEMS);
    if (newSize < 0)
        return(-1);
    tmp = xmlRealloc(list->items, newSize * sizeof(tmp[0]));
    if (tmp == NULL)
        return(-1);

    list->items = tmp;
    list->sizeItems = newSize;
    return(0);
}